

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O0

void __thiscall
Glucose::SharedCompanion::addLearnt(SharedCompanion *this,ParallelSolver *s,Lit unary)

{
  vec<Glucose::Lit> *pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lbool *plVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  Lit *sig;
  vec<Glucose::Lit> *in_RDI;
  size_t in_R8;
  Lit *in_stack_ffffffffffffffb8;
  vec<Glucose::lbool> *this_00;
  lbool local_1e;
  lbool local_1d;
  int local_1c;
  Lit local_4;
  
  local_4.x = in_EDX;
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0xb));
  pvVar1 = in_RDI + 0x13;
  local_1c = local_4.x;
  iVar3 = var(local_4);
  plVar5 = vec<Glucose::lbool>::operator[]((vec<Glucose::lbool> *)&pvVar1->sz,iVar3);
  lbool::lbool(&local_1d,'\x02');
  bVar2 = lbool::operator==(plVar5,local_1d);
  if (bVar2) {
    sig = &local_4;
    vec<Glucose::Lit>::push(in_RDI,in_stack_ffffffffffffffb8);
    uVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_4.x,(uchar *)sig,
                 (size_t *)CONCAT44(extraout_var,extraout_EDX),
                 (uchar *)CONCAT71(in_register_00000009,in_CL),in_R8);
    if ((uVar4 & 1) == 0) {
      lbool::lbool(&local_1e,'\0');
    }
    else {
      lbool::lbool(&local_1e,'\x01');
    }
    this_00 = (vec<Glucose::lbool> *)&in_RDI[0x13].sz;
    iVar3 = var(local_4);
    plVar5 = vec<Glucose::lbool>::operator[](this_00,iVar3);
    plVar5->value = local_1e.value;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0xb));
  return;
}

Assistant:

void SharedCompanion::addLearnt(ParallelSolver *s,Lit unary) {
  pthread_mutex_lock(&mutexSharedUnitCompanion);
  if (isUnary[var(unary)]==l_Undef) {
      unitLit.push(unary);
      isUnary[var(unary)] = sign(unary)?l_False:l_True;
  } 
  pthread_mutex_unlock(&mutexSharedUnitCompanion);
}